

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  this->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00144bd0;
  StrPair::Reset(&this->_value);
  StrPair::Reset(&this->_name);
  return;
}

Assistant:

virtual ~XMLAttribute()	{}